

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O0

void __thiscall DataFileTest::testWriteDouble(DataFileTest *this)

{
  size_t __n;
  void *__buf;
  undefined1 *puVar1;
  long *in_RDI;
  ComplexDouble c;
  int i;
  double im;
  double re;
  DataFileWriter<Complex<double>_> df;
  undefined1 local_38 [12];
  Codec in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  ValidSchema *in_stack_ffffffffffffffe0;
  double i_00;
  char *in_stack_ffffffffffffffe8;
  double r;
  DataFileWriter<Complex<double>_> in_stack_fffffffffffffff0;
  
  puVar1 = (undefined1 *)*in_RDI;
  __n = 100;
  avro::DataFileWriter<Complex<double>_>::DataFileWriter
            ((DataFileWriter<Complex<double>_> *)in_stack_fffffffffffffff0.base_._M_ptr,
             in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd4
            );
  r = 3.0;
  i_00 = 5.0;
  for (iVar2 = 0; iVar2 < 1000; iVar2 = iVar2 + 1) {
    Complex<double>::Complex((Complex<double> *)local_38,r,i_00);
    puVar1 = local_38;
    avro::DataFileWriter<Complex<double>_>::write
              ((DataFileWriter<Complex<double>_> *)&stack0xfffffffffffffff0,(int)puVar1,__buf,__n);
    r = (i_00 - 0.7) + r;
    i_00 = i_00 + 3.1;
  }
  avro::DataFileWriter<Complex<double>_>::close
            ((DataFileWriter<Complex<double>_> *)&stack0xfffffffffffffff0,(int)puVar1);
  avro::DataFileWriter<Complex<double>_>::~DataFileWriter
            ((DataFileWriter<Complex<double>_> *)0x247fe3);
  return;
}

Assistant:

void testWriteDouble() {
        avro::DataFileWriter<ComplexDouble> df(filename, writerSchema, 100);
        double re = 3.0;
        double im = 5.0;
        for (int i = 0; i < count; ++i, re += im - 0.7, im += 3.1) {
            ComplexDouble c(re, im);
            df.write(c);
        }
        df.close();
    }